

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O0

bool tinygltf::ParseUnsignedProperty
               (size_t *ret,string *err,json *o,string *property,bool required,string *parent_node)

{
  bool bVar1;
  char *member;
  ulong uVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  byte local_e1;
  unsigned_long uStack_e0;
  bool isUValue;
  size_t uValue;
  json *value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  undefined1 local_60 [8];
  json_const_iterator it;
  string *parent_node_local;
  bool required_local;
  string *property_local;
  json *o_local;
  string *err_local;
  size_t *ret_local;
  
  it.m_it.primitive_iterator.m_it = (difference_type)parent_node;
  nlohmann::detail::
  iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  ::iter_impl((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
               *)local_60);
  member = (char *)std::__cxx11::string::c_str();
  bVar1 = anon_unknown_57::FindMember(o,member,(json_const_iterator *)local_60);
  if (bVar1) {
    uValue = (size_t)anon_unknown_57::GetValue((json_const_iterator *)local_60);
    uStack_e0 = 0;
    local_e1 = nlohmann::
               basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
               ::is_number_unsigned
                         ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                           *)uValue);
    if ((bool)local_e1) {
      uStack_e0 = nlohmann::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                  ::get<unsigned_long,_unsigned_long,_0>
                            ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                              *)uValue);
    }
    if ((local_e1 & 1) == 0) {
      if ((required) && (err != (string *)0x0)) {
        std::operator+(&local_128,"\'",property);
        std::operator+(&local_108,&local_128,"\' property is not a positive integer.\n");
        std::__cxx11::string::operator+=((string *)err,(string *)&local_108);
        std::__cxx11::string::~string((string *)&local_108);
        std::__cxx11::string::~string((string *)&local_128);
      }
      ret_local._7_1_ = false;
    }
    else {
      if (ret != (size_t *)0x0) {
        *ret = uStack_e0;
      }
      ret_local._7_1_ = true;
    }
  }
  else {
    if ((required) && (err != (string *)0x0)) {
      std::operator+(&local_a0,"\'",property);
      std::operator+(&local_80,&local_a0,"\' property is missing");
      std::__cxx11::string::operator+=((string *)err,(string *)&local_80);
      std::__cxx11::string::~string((string *)&local_80);
      std::__cxx11::string::~string((string *)&local_a0);
      uVar2 = std::__cxx11::string::empty();
      if ((uVar2 & 1) == 0) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&value,
                       " in ",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              it.m_it.primitive_iterator.m_it);
        std::__cxx11::string::operator+=((string *)err,(string *)&value);
        std::__cxx11::string::~string((string *)&value);
      }
      std::__cxx11::string::operator+=((string *)err,".\n");
    }
    ret_local._7_1_ = false;
  }
  return ret_local._7_1_;
}

Assistant:

static bool ParseUnsignedProperty(size_t *ret, std::string *err, const json &o,
                                  const std::string &property,
                                  const bool required,
                                  const std::string &parent_node = "") {
  json_const_iterator it;
  if (!FindMember(o, property.c_str(), it)) {
    if (required) {
      if (err) {
        (*err) += "'" + property + "' property is missing";
        if (!parent_node.empty()) {
          (*err) += " in " + parent_node;
        }
        (*err) += ".\n";
      }
    }
    return false;
  }

  auto &value = GetValue(it);

  size_t uValue = 0;
  bool isUValue;
#ifdef TINYGLTF_USE_RAPIDJSON
  isUValue = false;
  if (value.IsUint()) {
    uValue = value.GetUint();
    isUValue = true;
  } else if (value.IsUint64()) {
    uValue = value.GetUint64();
    isUValue = true;
  }
#else
  isUValue = value.is_number_unsigned();
  if (isUValue) {
    uValue = value.get<size_t>();
  }
#endif
  if (!isUValue) {
    if (required) {
      if (err) {
        (*err) += "'" + property + "' property is not a positive integer.\n";
      }
    }
    return false;
  }

  if (ret) {
    (*ret) = uValue;
  }

  return true;
}